

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O2

void __thiscall
amrex::FluxRegister::FineAdd
          (FluxRegister *this,MultiFab *mflx,int dir,int srccomp,int destcomp,int numcomp,Real mult)

{
  long lVar1;
  long lVar2;
  MFIter mfi;
  RunOn in_stack_ffffffffffffff60;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)mflx,'\0');
  while (lVar1 = (long)local_90.currentIndex, local_90.currentIndex < local_90.endIndex) {
    lVar2 = lVar1;
    if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      lVar2 = (long)((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[lVar1];
    }
    FineAdd(this,(mflx->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar2],dir,
            ((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar1],srccomp,destcomp,numcomp,mult,in_stack_ffffffffffffff60);
    MFIter::operator++(&local_90);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
FluxRegister::FineAdd (const MultiFab& mflx,
                       int             dir,
                       int             srccomp,
                       int             destcomp,
                       int             numcomp,
                       Real            mult)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mflx); mfi.isValid(); ++mfi)
    {
        const int k = mfi.index();
        FineAdd(mflx[mfi],dir,k,srccomp,destcomp,numcomp,mult,RunOn::Gpu);
    }
}